

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall Lib::Stack<Kernel::PolyNf>::expand(Stack<Kernel::PolyNf> *this)

{
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *this_00;
  char *pcVar1;
  PolyNf *pPVar2;
  PolyNf *pPVar3;
  ulong uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  size_t sVar7;
  anon_class_16_2_f84bbffd f;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar4 = sVar7 * 0x18;
  if (uVar4 == 0) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    pPVar3 = (PolyNf *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pPVar3 = (PolyNf *)::operator_new(uVar4,0x10);
  }
  if (this->_capacity == 0) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      this_00 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                 *)((pPVar3->super_PolyNfSuper)._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ._content + lVar5 + -1);
      pPVar2 = this->_stack;
      pcVar1 = (pPVar3->super_PolyNfSuper)._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content + lVar5 + -1;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pcVar1 = (pPVar3->super_PolyNfSuper)._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content + lVar5 + 0xf;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      f.other = (pPVar2->super_PolyNfSuper)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content + lVar5 + -1;
      (pPVar3->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[lVar5 + -1] =
           (pPVar2->super_PolyNfSuper)._inner.
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           .
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content[lVar5 + -1] & 3;
      f.this = (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                *)this_00;
      CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>&&)::_lambda(auto:1)_1_>
                (this_00,f);
      uVar6 = uVar6 + 1;
      uVar4 = this->_capacity;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < uVar4);
    pPVar2 = this->_stack;
    if (pPVar2 != (PolyNf *)0x0) {
      uVar6 = uVar4 * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pPVar2;
      }
      else if (uVar6 < 0x11) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pPVar2;
      }
      else if (uVar6 < 0x19) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pPVar2;
      }
      else if (uVar6 < 0x21) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pPVar2;
      }
      else if (uVar6 < 0x31) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pPVar2;
      }
      else if (uVar6 < 0x41) {
        *(undefined8 *)
         &(pPVar2->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pPVar2;
      }
      else {
        operator_delete(pPVar2,0x10);
        uVar4 = this->_capacity;
      }
    }
  }
  this->_stack = pPVar3;
  this->_cursor = pPVar3 + uVar4;
  this->_end = pPVar3 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }